

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiledInstancer::DecoratorTiledInstancer
          (DecoratorTiledInstancer *this,size_t num_tiles)

{
  size_t num_tiles_local;
  DecoratorTiledInstancer *this_local;
  
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledInstancer_00816008;
  ::std::
  vector<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
  ::vector(&this->tile_property_ids);
  ::std::
  vector<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
  ::reserve(&this->tile_property_ids,num_tiles);
  return;
}

Assistant:

DecoratorTiledInstancer::DecoratorTiledInstancer(size_t num_tiles)
{
	tile_property_ids.reserve(num_tiles);
}